

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateInitDefaultSplitInstance
          (MessageGenerator *this,Printer *p)

{
  Options *opts;
  Descriptor *desc;
  pointer ppFVar1;
  FieldDescriptor *field;
  bool bVar2;
  FieldGenerator *this_00;
  pointer ppFVar3;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_138;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Options local_108;
  
  opts = &this->options_;
  bVar2 = ShouldSplit(this->descriptor_,opts);
  if (bVar2) {
    desc = this->descriptor_;
    Options::Options(&local_108,opts);
    cpp::anon_unknown_0::ClassVars
              ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                *)&t,desc,&local_108);
    vars.len_ = (long)(t.storage_.callback_buffer_._0_8_ - t.storage_._0_8_) / 0xb8;
    vars.ptr_ = (pointer)t.storage_._0_8_;
    io::Printer::WithVars(&v,p,vars);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)&t);
    Options::~Options(&local_108);
    MakeTrackerCalls(&local_138,this->descriptor_,opts);
    vars_00.len_ = ((long)local_138.
                          super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_138.
                         super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0xb8;
    vars_00.ptr_ = local_138.
                   super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    io::Printer::WithVars(&t,p,vars_00);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector(&local_138);
    io::Printer::Emit(p,1,"\n");
    ppFVar1 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar3 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar3 != ppFVar1;
        ppFVar3 = ppFVar3 + 1) {
      field = *ppFVar3;
      bVar2 = ShouldSplit(field,opts);
      if (bVar2) {
        this_00 = FieldGeneratorTable::get(&this->field_generators_,field);
        FieldGenerator::GenerateConstexprAggregateInitializer(this_00,p);
      }
    }
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&t);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&v);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateInitDefaultSplitInstance(io::Printer* p) {
  if (!ShouldSplit(descriptor_, options_)) return;

  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  p->Emit("\n");
  for (const auto* field : optimized_order_) {
    if (ShouldSplit(field, options_)) {
      field_generators_.get(field).GenerateConstexprAggregateInitializer(p);
    }
  }
}